

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET mpp_enc_proc_hw_cfg(MppEncHwCfg *dst,MppEncHwCfg *src)

{
  undefined1 local_1e4 [8];
  MppEncHwCfg bak;
  RK_U32 change;
  MPP_RET ret;
  MppEncHwCfg *src_local;
  MppEncHwCfg *dst_local;
  
  bak.aq_rnge_arr[9] = 0;
  bak.aq_rnge_arr[8] = src->change;
  if (bak.aq_rnge_arr[8] != 0) {
    memcpy(local_1e4,dst,0x1c4);
    if ((bak.aq_rnge_arr[8] & 1U) != 0) {
      dst->qp_delta_row = src->qp_delta_row;
    }
    if ((bak.aq_rnge_arr[8] & 2U) != 0) {
      dst->qp_delta_row_i = src->qp_delta_row_i;
    }
    if ((bak.aq_rnge_arr[8] & 4U) != 0) {
      memcpy(dst->aq_thrd_i,src->aq_thrd_i,0x40);
    }
    if ((bak.aq_rnge_arr[8] & 8U) != 0) {
      memcpy(dst->aq_thrd_p,src->aq_thrd_p,0x40);
    }
    if ((bak.aq_rnge_arr[8] & 0x10U) != 0) {
      memcpy(dst->aq_step_i,src->aq_step_i,0x40);
    }
    if ((bak.aq_rnge_arr[8] & 0x20U) != 0) {
      memcpy(dst->aq_step_p,src->aq_step_p,0x40);
    }
    if ((bak.aq_rnge_arr[8] & 0x400U) != 0) {
      dst->qbias_i = src->qbias_i;
    }
    if ((bak.aq_rnge_arr[8] & 0x800U) != 0) {
      dst->qbias_p = src->qbias_p;
    }
    if ((bak.aq_rnge_arr[8] & 0x1000U) != 0) {
      dst->qbias_en = src->qbias_en;
    }
    if ((bak.aq_rnge_arr[8] & 0x40U) != 0) {
      dst->mb_rc_disable = src->mb_rc_disable;
    }
    if ((bak.aq_rnge_arr[8] & 0x100U) != 0) {
      *(undefined8 *)dst->mode_bias = *(undefined8 *)src->mode_bias;
      *(undefined8 *)(dst->mode_bias + 2) = *(undefined8 *)(src->mode_bias + 2);
      *(undefined8 *)(dst->mode_bias + 4) = *(undefined8 *)(src->mode_bias + 4);
      *(undefined8 *)(dst->mode_bias + 6) = *(undefined8 *)(src->mode_bias + 6);
    }
    if ((bak.aq_rnge_arr[8] & 0x200U) != 0) {
      dst->skip_bias_en = src->skip_bias_en;
      dst->skip_sad = src->skip_sad;
      dst->skip_bias = src->skip_bias;
    }
    if ((dst->qp_delta_row < 0) || (dst->qp_delta_row_i < 0)) {
      _mpp_log_l(2,"mpp_enc","invalid hw qp delta row [%d:%d]\n",(char *)0x0,
                 (ulong)(uint)dst->qp_delta_row_i,(ulong)(uint)dst->qp_delta_row);
      bak.aq_rnge_arr[9] = -6;
    }
    dst->change = bak.aq_rnge_arr[8] | dst->change;
    if (bak.aq_rnge_arr[9] != 0) {
      _mpp_log_l(2,"mpp_enc","failed to accept new hw config\n","mpp_enc_proc_hw_cfg");
      memcpy(dst,local_1e4,0x1c4);
    }
  }
  return bak.aq_rnge_arr[9];
}

Assistant:

MPP_RET mpp_enc_proc_hw_cfg(MppEncHwCfg *dst, MppEncHwCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncHwCfg bak = *dst;

        if (change & MPP_ENC_HW_CFG_CHANGE_QP_ROW)
            dst->qp_delta_row = src->qp_delta_row;

        if (change & MPP_ENC_HW_CFG_CHANGE_QP_ROW_I)
            dst->qp_delta_row_i = src->qp_delta_row_i;

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_THRD_I)
            memcpy(dst->aq_thrd_i, src->aq_thrd_i, sizeof(dst->aq_thrd_i));

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_THRD_P)
            memcpy(dst->aq_thrd_p, src->aq_thrd_p, sizeof(dst->aq_thrd_p));

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_STEP_I)
            memcpy(dst->aq_step_i, src->aq_step_i, sizeof(dst->aq_step_i));

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_STEP_P)
            memcpy(dst->aq_step_p, src->aq_step_p, sizeof(dst->aq_step_p));

        if (change & MPP_ENC_HW_CFG_CHANGE_QBIAS_I)
            dst->qbias_i = src->qbias_i;

        if (change & MPP_ENC_HW_CFG_CHANGE_QBIAS_P)
            dst->qbias_p = src->qbias_p;

        if (change & MPP_ENC_HW_CFG_CHANGE_QBIAS_EN)
            dst->qbias_en = src->qbias_en;

        if (change & MPP_ENC_HW_CFG_CHANGE_MB_RC)
            dst->mb_rc_disable = src->mb_rc_disable;

        if (change & MPP_ENC_HW_CFG_CHANGE_CU_MODE_BIAS)
            memcpy(dst->mode_bias, src->mode_bias, sizeof(dst->mode_bias));

        if (change & MPP_ENC_HW_CFG_CHANGE_CU_SKIP_BIAS) {
            dst->skip_bias_en = src->skip_bias_en;
            dst->skip_sad = src->skip_sad;
            dst->skip_bias = src->skip_bias;
        }

        if (dst->qp_delta_row < 0 || dst->qp_delta_row_i < 0) {
            mpp_err("invalid hw qp delta row [%d:%d]\n",
                    dst->qp_delta_row_i, dst->qp_delta_row);
            ret = MPP_ERR_VALUE;
        }

        dst->change |= change;

        if (ret) {
            mpp_err_f("failed to accept new hw config\n");
            *dst = bak;
        }
    }

    return ret;
}